

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

CTX_PTR ReduceOrder(CPpmd8 *p,CPpmd_State *s1,CTX_PTR c)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  CPpmd_State *pCVar4;
  CPpmd_Void_Ref v;
  CTX_PTR pCVar5;
  CPpmd_State *s2;
  CTX_PTR successor;
  CPpmd_Void_Ref upBranch;
  CTX_PTR c1;
  CPpmd_State *s;
  CTX_PTR c_local;
  CPpmd_State *s1_local;
  CPpmd8 *p_local;
  
  v = (int)p->Text - (int)p->Base;
  SetSuccessor(p->FoundState,v);
  p->OrderFall = p->OrderFall + 1;
  s = (CPpmd_State *)c;
  c_local = (CTX_PTR)s1;
  while( true ) {
    if (c_local == (CTX_PTR)0x0) {
      iVar2._0_2_ = s[1].SuccessorLow;
      iVar2._2_2_ = s[1].SuccessorHigh;
      if (iVar2 == 0) {
        return (CTX_PTR)s;
      }
      uVar3._0_2_ = s[1].SuccessorLow;
      uVar3._2_2_ = s[1].SuccessorHigh;
      s = (CPpmd_State *)(p->Base + uVar3);
      if (s->Symbol == '\0') {
        c1 = (CTX_PTR)&s->SuccessorLow;
        *(char *)((long)&s->SuccessorLow + 1) =
             *(char *)((long)&s->SuccessorLow + 1) + (*(byte *)((long)&s->SuccessorLow + 1) < 0x20);
      }
      else {
        c1 = (CTX_PTR)(p->Base + *(uint *)&s->SuccessorHigh);
        if (p->Base[*(uint *)&s->SuccessorHigh] != p->FoundState->Symbol) {
          do {
            c1 = (CTX_PTR)((long)&c1->Stats + 2);
          } while (c1->NumStats != p->FoundState->Symbol);
        }
        if (c1->Flags < 0x73) {
          c1->Flags = c1->Flags + '\x02';
          s->SuccessorLow = s->SuccessorLow + 2;
        }
      }
    }
    else {
      uVar1._0_2_ = s[1].SuccessorLow;
      uVar1._2_2_ = s[1].SuccessorHigh;
      s = (CPpmd_State *)(p->Base + uVar1);
      c1 = c_local;
      c_local = (CTX_PTR)0x0;
    }
    if (*(int *)&c1->SummFreq != 0) break;
    SetSuccessor((CPpmd_State *)c1,v);
    p->OrderFall = p->OrderFall + 1;
  }
  if (*(uint *)&c1->SummFreq <= v) {
    pCVar4 = p->FoundState;
    p->FoundState = (CPpmd_State *)c1;
    pCVar5 = CreateSuccessors(p,0,(CPpmd_State *)0x0,(CTX_PTR)s);
    if (pCVar5 == (CTX_PTR)0x0) {
      SetSuccessor((CPpmd_State *)c1,0);
    }
    else {
      SetSuccessor((CPpmd_State *)c1,(int)pCVar5 - (int)p->Base);
    }
    p->FoundState = pCVar4;
  }
  if ((p->OrderFall == 1) && (c == p->MaxContext)) {
    SetSuccessor(p->FoundState,*(CPpmd_Void_Ref *)&c1->SummFreq);
    p->Text = p->Text + -1;
  }
  if (*(int *)&c1->SummFreq == 0) {
    p_local = (CPpmd8 *)0x0;
  }
  else {
    p_local = (CPpmd8 *)(p->Base + *(uint *)&c1->SummFreq);
  }
  return (CTX_PTR)p_local;
}

Assistant:

static CTX_PTR ReduceOrder(CPpmd8 *p, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State *s = NULL;
  CTX_PTR c1 = c;
  CPpmd_Void_Ref upBranch = REF(p->Text);
  
  #ifdef PPMD8_FREEZE_SUPPORT
  /* The BUG in Shkarin's code was fixed: ps could overflow in CUT_OFF mode. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;
  ps[numPs++] = p->FoundState;
  #endif

  SetSuccessor(p->FoundState, upBranch);
  p->OrderFall++;

  for (;;)
  {
    if (s1)
    {
      c = SUFFIX(c);
      s = s1;
      s1 = NULL;
    }
    else
    {
      if (!c->Suffix)
      {
        #ifdef PPMD8_FREEZE_SUPPORT
        if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
        {
          do { SetSuccessor(ps[--numPs], REF(c)); } while (numPs);
          RESET_TEXT(1);
          p->OrderFall = 1;
        }
        #endif
        return c;
      }
      c = SUFFIX(c);
      if (c->NumStats)
      {
        if ((s = STATS(c))->Symbol != p->FoundState->Symbol)
          do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s->Freq < MAX_FREQ - 9)
        {
          s->Freq += 2;
          c->SummFreq += 2;
        }
      }
      else
      {
        s = ONE_STATE(c);
        s->Freq = (Byte)(s->Freq + (s->Freq < 32));
      }
    }
    if (SUCCESSOR(s))
      break;
    #ifdef PPMD8_FREEZE_SUPPORT
    ps[numPs++] = s;
    #endif
    SetSuccessor(s, upBranch);
    p->OrderFall++;
  }
  
  #ifdef PPMD8_FREEZE_SUPPORT
  if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    c = CTX(SUCCESSOR(s));
    do { SetSuccessor(ps[--numPs], REF(c)); } while (numPs);
    RESET_TEXT(1);
    p->OrderFall = 1;
    return c;
  }
  else
  #endif
  if (SUCCESSOR(s) <= upBranch)
  {
    CTX_PTR successor;
    CPpmd_State *s2 = p->FoundState;
    p->FoundState = s;

    successor = CreateSuccessors(p, False, NULL, c);
    if (successor == NULL)
      SetSuccessor(s, 0);
    else
      SetSuccessor(s, REF(successor));
    p->FoundState = s2;
  }
  
  if (p->OrderFall == 1 && c1 == p->MaxContext)
  {
    SetSuccessor(p->FoundState, SUCCESSOR(s));
    p->Text--;
  }
  if (SUCCESSOR(s) == 0)
    return NULL;
  return CTX(SUCCESSOR(s));
}